

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<int>::AddForwardIterator<int*>
          (RepeatedField<int> *this,int *begin,int *end)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool is_soo;
  int new_size;
  bool is_soo_00;
  char *local_40;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  is_soo_00 = (uVar1 & 4) == 0;
  iVar3 = internal::SooRep::size(&this->soo_rep_,is_soo_00);
  if ((uVar1 & 4) == 0) {
    iVar4 = 2;
    local_40 = (char *)((long)&(this->soo_rep_).field_0 + 8);
  }
  else {
    iVar4 = (this->soo_rep_).field_0.long_rep.capacity;
    local_40 = internal::LongSooRep::elements((LongSooRep *)this);
  }
  new_size = (int)((ulong)((long)end - (long)begin) >> 2) + iVar3;
  bVar2 = iVar4 < new_size;
  if (bVar2) {
    Grow(this,(uVar1 & 4) == 0,iVar3,new_size);
    local_40 = internal::LongSooRep::elements((LongSooRep *)this);
    iVar4 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  bVar2 = !bVar2;
  is_soo = bVar2 && is_soo_00;
  iVar3 = ExchangeCurrentSize(this,is_soo,new_size);
  if (end != begin) {
    memcpy(local_40 + (long)iVar3 * 4,begin,(long)end - (long)begin);
  }
  if (is_soo != ((undefined1  [16])
                 ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                (undefined1  [16])0x0)) {
    internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x38e);
  }
  iVar3 = internal::SooRep::size(&this->soo_rep_,is_soo);
  if (new_size != iVar3) {
    internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x390);
  }
  if (bVar2 && is_soo_00) {
    pcVar5 = (char *)((long)&(this->soo_rep_).field_0 + 8);
  }
  else {
    pcVar5 = internal::LongSooRep::elements((LongSooRep *)this);
  }
  if (local_40 != pcVar5) {
    internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x392);
  }
  if (is_soo) {
    iVar3 = 2;
  }
  else {
    iVar3 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar4 != iVar3) {
    internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x394);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::AddForwardIterator(Iter begin, Iter end) {
  bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  int capacity = Capacity(is_soo);
  Element* elem = unsafe_elements(is_soo);
  int new_size = old_size + static_cast<int>(std::distance(begin, end));
  if (ABSL_PREDICT_FALSE(new_size > capacity)) {
    Grow(is_soo, old_size, new_size);
    is_soo = false;
    elem = unsafe_elements(is_soo);
    capacity = Capacity(is_soo);
  }
  UninitializedCopy(begin, end, elem + ExchangeCurrentSize(is_soo, new_size));

  // The below helps the compiler optimize dense loops.
  // Note: we can't call functions in PROTOBUF_ASSUME so use local variables.
  [[maybe_unused]] const bool final_is_soo = this->is_soo();
  PROTOBUF_ASSUME(is_soo == final_is_soo);
  [[maybe_unused]] const int final_size = size(is_soo);
  PROTOBUF_ASSUME(new_size == final_size);
  [[maybe_unused]] Element* const final_elements = unsafe_elements(is_soo);
  PROTOBUF_ASSUME(elem == final_elements);
  [[maybe_unused]] const int final_capacity = Capacity(is_soo);
  PROTOBUF_ASSUME(capacity == final_capacity);
}